

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.c
# Opt level: O0

void communicate(void *shared_memory,Arguments *args,Sync *sync)

{
  void *__ptr;
  int *in_RSI;
  void *in_RDI;
  void *buffer;
  
  __ptr = malloc((long)*in_RSI);
  sync_notify((Sync *)0x10235f);
  printf("4\n");
  while (0 < in_RSI[1]) {
    sync_wait((Sync *)0x102382);
    printf("5\n");
    memcpy(__ptr,in_RDI,(long)*in_RSI);
    memset(in_RDI,0x32,(long)*in_RSI);
    printf("6\n");
    sync_notify((Sync *)0x1023d6);
    printf("7\n");
    in_RSI[1] = in_RSI[1] + -1;
  }
  free(__ptr);
  return;
}

Assistant:

void communicate(void* shared_memory,
								 struct Arguments* args,
								 struct Sync* sync) {
	// Buffer into which to read data
	void* buffer = malloc(args->size);

	sync_notify(sync);

	printf("4\n");

	for (; args->count > 0; --args->count) {
		sync_wait(sync);

		printf("5\n");

		// Read from memory
		memcpy(buffer, shared_memory, args->size);
		// Write back
		memset(shared_memory, '2', args->size);

		printf("6\n");

		sync_notify(sync);

		printf("7\n");
	}

	free(buffer);
}